

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[28],char_const*>
                   (string *__return_storage_ptr__,char (*a) [28],char **b)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b8;
  string_view local_a0;
  string *local_90;
  cmAlphaNum local_88;
  cmAlphaNum local_50;
  
  cmAlphaNum::cmAlphaNum(&local_50,*a);
  local_b8.first = cmAlphaNum::View(&local_50);
  local_b8.second = local_50.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_88,*b);
  local_a0 = cmAlphaNum::View(&local_88);
  local_90 = local_88.RValueString_;
  views._M_len = 2;
  views._M_array = &local_b8;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}